

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O0

void __thiscall
cfd::core::Privkey::Privkey(Privkey *this,ByteData *byte_data,NetType net_type,bool is_compressed)

{
  bool bVar1;
  CfdException *this_00;
  allocator local_a1;
  string local_a0;
  string local_80;
  CfdSourceLocation local_60;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  byte local_1d;
  NetType local_1c;
  bool is_compressed_local;
  ByteData *pBStack_18;
  NetType net_type_local;
  ByteData *byte_data_local;
  Privkey *this_local;
  
  local_1d = is_compressed;
  local_1c = net_type;
  pBStack_18 = byte_data;
  byte_data_local = &this->data_;
  ByteData::ByteData(&this->data_,byte_data);
  this->is_compressed_ = (bool)(local_1d & 1);
  this->net_type_ = local_1c;
  ByteData::GetBytes(&local_38,&this->data_);
  bVar1 = IsValid(&local_38);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_38);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    return;
  }
  local_60.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/src/cfdcore_key.cpp"
               ,0x2f);
  local_60.filename = local_60.filename + 1;
  local_60.line = 0x278;
  local_60.funcname = "Privkey";
  ByteData::GetHex_abi_cxx11_(&local_80,&this->data_);
  logger::warn<std::__cxx11::string>(&local_60,"Invalid Privkey data. hex={}.",&local_80);
  ::std::__cxx11::string::~string((string *)&local_80);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_a0,"Invalid Privkey data.",&local_a1);
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_a0);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey::Privkey(
    const ByteData &byte_data, NetType net_type, bool is_compressed)
    : data_(byte_data), is_compressed_(is_compressed), net_type_(net_type) {
  if (!IsValid(data_.GetBytes())) {
    warn(CFD_LOG_SOURCE, "Invalid Privkey data. hex={}.", data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data.");
  }
}